

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-pprint.cc
# Opt level: O1

ostream * std::operator<<(ostream *ofs,vector<float,_std::allocator<float>_> *v)

{
  size_t sVar1;
  ulong uVar2;
  char buf [128];
  long *local_d8;
  long local_d0;
  long local_c8 [2];
  char local_b8 [136];
  
  std::__ostream_insert<char,std::char_traits<char>>(ofs,"[",1);
  if ((v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_finish !=
      (v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_start) {
    uVar2 = 0;
    do {
      if (uVar2 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>(ofs,", ",2);
      }
      floaxie::ftoa<float,char>
                ((v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar2],local_b8);
      local_d8 = local_c8;
      sVar1 = strlen(local_b8);
      __cxx11::string::_M_construct<char_const*>((string *)&local_d8,local_b8,local_b8 + sVar1);
      std::__ostream_insert<char,std::char_traits<char>>(ofs,(char *)local_d8,local_d0);
      if (local_d8 != local_c8) {
        operator_delete(local_d8,local_c8[0] + 1);
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 < (ulong)((long)(v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                                   super__Vector_impl_data._M_finish -
                             (long)(v->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                                   super__Vector_impl_data._M_start >> 2));
  }
  std::__ostream_insert<char,std::char_traits<char>>(ofs,"]",1);
  return ofs;
}

Assistant:

std::ostream &operator<<(std::ostream &ofs, const std::vector<float> &v) {
  // Use floaxie
  char buf[128];

  // TODO: multi-threading for further performance gain?

  ofs << "[";
  for (size_t i = 0; i < v.size(); i++) {
    if (i > 0) {
      ofs << ", ";
    }
    floaxie::ftoa(v[i], buf);
    ofs << std::string(buf);
  }
  ofs << "]";

  return ofs;
}